

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# changesoplex.hpp
# Opt level: O0

void __thiscall
soplex::SPxSolverBase<double>::changeElement
          (SPxSolverBase<double> *this,int i,int j,double *val,bool scale)

{
  byte bVar1;
  SPxStatus SVar2;
  int in_EDX;
  int in_ESI;
  SPxSolverBase<double> *in_RDI;
  byte in_R8B;
  bool in_stack_0000006f;
  double *in_stack_00000070;
  int in_stack_00000078;
  int in_stack_0000007c;
  SPxLPBase<double> *in_stack_00000080;
  undefined7 in_stack_ffffffffffffffe0;
  
  bVar1 = in_R8B & 1;
  if ((-1 < in_ESI) && (-1 < in_EDX)) {
    forceRecompNonbasicValue(in_RDI);
    SPxLPBase<double>::changeElement
              (in_stack_00000080,in_stack_0000007c,in_stack_00000078,in_stack_00000070,
               in_stack_0000006f);
    SVar2 = SPxBasisBase<double>::status(&in_RDI->super_SPxBasisBase<double>);
    if (NO_PROBLEM < SVar2) {
      SPxBasisBase<double>::changedElement
                ((SPxBasisBase<double> *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
                 (int)((ulong)in_RDI >> 0x20),(int)in_RDI);
    }
    (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x77])();
  }
  return;
}

Assistant:

void SPxSolverBase<R>::changeElement(int i, int j, const R& val, bool scale)
{
   if(i < 0 || j < 0)
      return;

   forceRecompNonbasicValue();

   SPxLPBase<R>::changeElement(i, j, val, scale);

   if(SPxBasisBase<R>::status() > SPxBasisBase<R>::NO_PROBLEM)
      SPxBasisBase<R>::changedElement(i, j);

   unInit();
}